

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

void __thiscall cmGlobalGenerator::Configure(cmGlobalGenerator *this)

{
  pointer *pppcVar1;
  cmake *pcVar2;
  iterator __position;
  cmMakefile *pcVar3;
  pointer pcVar4;
  undefined *puVar5;
  bool bVar6;
  string *psVar7;
  cmMakefile *pcVar8;
  ostream *poVar9;
  undefined **ppuVar10;
  undefined1 mf [8];
  cmMakefile *dirMf;
  string f;
  vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  globalTargets;
  cmStateSnapshot snapshot;
  char num [100];
  cmMakefile *local_270;
  pointer local_268;
  string local_260;
  pointer local_240;
  undefined1 local_238 [8];
  cmMakefile *pcStack_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228 [6];
  ios_base local_1c8 [272];
  cmStateSnapshot local_b8;
  
  this->FirstTimeProgress = 0.0;
  ClearGeneratorMembers(this);
  pcVar2 = this->CMakeInstance;
  local_b8.Position.Position = (pcVar2->CurrentSnapshot).Position.Position;
  local_b8.State = (pcVar2->CurrentSnapshot).State;
  local_b8.Position.Tree = (pcVar2->CurrentSnapshot).Position.Tree;
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_238,&local_b8);
  psVar7 = cmake::GetHomeDirectory_abi_cxx11_(this->CMakeInstance);
  cmStateDirectory::SetCurrentSource((cmStateDirectory *)local_238,psVar7);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_238,&local_b8);
  psVar7 = cmake::GetHomeOutputDirectory_abi_cxx11_(this->CMakeInstance);
  cmStateDirectory::SetCurrentBinary((cmStateDirectory *)local_238,psVar7);
  pcVar8 = (cmMakefile *)operator_new(0x7e8);
  cmMakefile::cmMakefile(pcVar8,this,&local_b8);
  local_270 = pcVar8;
  cmMakefile::SetRecursionDepth(pcVar8,this->RecursionDepth);
  __position._M_current =
       (this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmMakefile*,std::allocator<cmMakefile*>>::_M_realloc_insert<cmMakefile*const&>
              ((vector<cmMakefile*,std::allocator<cmMakefile*>> *)&this->Makefiles,__position,
               &local_270);
  }
  else {
    *__position._M_current = local_270;
    pppcVar1 = &(this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  IndexMakefile(this,local_270);
  psVar7 = cmake::GetHomeOutputDirectory_abi_cxx11_(this->CMakeInstance);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&this->BinaryDirectories,psVar7);
  this->ConfigureDoneCMP0026AndCMP0024 = false;
  cmMakefile::Configure(local_270);
  cmMakefile::EnforceDirectoryLevelRules(local_270);
  this->ConfigureDoneCMP0026AndCMP0024 = true;
  local_238 = (undefined1  [8])0x0;
  pcStack_230 = (cmMakefile *)0x0;
  local_228[0]._M_allocated_capacity = (cmState *)0x0;
  CreateDefaultGlobalTargets
            (this,(vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
                   *)local_238);
  local_268 = (this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_240 = (this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  if (local_268 != local_240) {
    do {
      pcVar8 = pcStack_230;
      if (local_238 != (undefined1  [8])pcStack_230) {
        pcVar3 = *local_268;
        mf = local_238;
        do {
          CreateGlobalTarget((cmGlobalGenerator *)&stack0xffffffffffffff68,(GlobalTargetInfo *)this,
                             (cmMakefile *)mf);
          std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmTarget>,std::allocator<std::pair<std::__cxx11::string_const,cmTarget>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<std::__cxx11::string_const&,cmTarget>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmTarget>,std::allocator<std::pair<std::__cxx11::string_const,cmTarget>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)&pcVar3->Targets,mf,(cmGlobalGenerator *)&stack0xffffffffffffff68);
          cmTarget::~cmTarget((cmTarget *)&stack0xffffffffffffff68);
          mf = (undefined1  [8])&(((cmMakefile *)mf)->Targets)._M_h._M_element_count;
        } while (mf != (undefined1  [8])pcVar8);
      }
      local_268 = local_268 + 1;
    } while (local_268 != local_240);
  }
  std::
  vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  ::~vector((vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
             *)local_238);
  sprintf(&stack0xffffffffffffff68,"%d",
          (ulong)((long)(this->Makefiles).
                        super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(this->Makefiles).
                       super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 3);
  pcVar2 = this->CMakeInstance;
  local_238 = (undefined1  [8])local_228;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_238,"CMAKE_NUMBER_OF_MAKEFILES","");
  cmake::AddCacheEntry
            (pcVar2,(string *)local_238,&stack0xffffffffffffff68,"number of local generators",4);
  if (local_238 != (undefined1  [8])local_228) {
    operator_delete((void *)local_238,(ulong)(local_228[0]._M_allocated_capacity + 1));
  }
  CheckTargetProperties(this);
  if (this->CMakeInstance->CurrentWorkingMode == NORMAL_MODE) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
    if (((cmSystemTools::s_ErrorOccured != false) || (cmSystemTools::s_FatalErrorOccured != false))
       || (bVar6 = cmSystemTools::GetInterruptFlag(), bVar6)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_238,"Configuring incomplete, errors occurred!",0x28);
      ppuVar10 = &PTR_anon_var_dwarf_41ea12_006762f8;
      do {
        psVar7 = cmake::GetHomeOutputDirectory_abi_cxx11_(this->CMakeInstance);
        pcVar4 = (psVar7->_M_dataplus)._M_p;
        local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_260,pcVar4,pcVar4 + psVar7->_M_string_length);
        std::__cxx11::string::append((char *)&local_260);
        std::__cxx11::string::append((char *)&local_260);
        std::__cxx11::string::append((char *)&local_260);
        bVar6 = cmsys::SystemTools::FileExists(&local_260);
        if (bVar6) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_238,"\nSee also \"",0xb);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_238,local_260._M_dataplus._M_p,
                              local_260._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\".",2);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260._M_dataplus._M_p != &local_260.field_2) {
          operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
        }
        puVar5 = *ppuVar10;
        ppuVar10 = ppuVar10 + 1;
      } while (puVar5 != (undefined *)0x0);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_238,"Configuring done",0x10);
    }
    pcVar2 = this->CMakeInstance;
    std::__cxx11::stringbuf::str();
    cmake::UpdateProgress(pcVar2,&local_260,-1.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
    std::ios_base::~ios_base(local_1c8);
    return;
  }
  return;
}

Assistant:

void cmGlobalGenerator::Configure()
{
  this->FirstTimeProgress = 0.0f;
  this->ClearGeneratorMembers();

  cmStateSnapshot snapshot = this->CMakeInstance->GetCurrentSnapshot();

  snapshot.GetDirectory().SetCurrentSource(
    this->CMakeInstance->GetHomeDirectory());
  snapshot.GetDirectory().SetCurrentBinary(
    this->CMakeInstance->GetHomeOutputDirectory());

  cmMakefile* dirMf = new cmMakefile(this, snapshot);
  dirMf->SetRecursionDepth(this->RecursionDepth);
  this->Makefiles.push_back(dirMf);
  this->IndexMakefile(dirMf);

  this->BinaryDirectories.insert(
    this->CMakeInstance->GetHomeOutputDirectory());

  // now do it
  this->ConfigureDoneCMP0026AndCMP0024 = false;
  dirMf->Configure();
  dirMf->EnforceDirectoryLevelRules();

  this->ConfigureDoneCMP0026AndCMP0024 = true;

  // Put a copy of each global target in every directory.
  {
    std::vector<GlobalTargetInfo> globalTargets;
    this->CreateDefaultGlobalTargets(globalTargets);

    for (cmMakefile* mf : this->Makefiles) {
      auto& targets = mf->GetTargets();
      for (GlobalTargetInfo const& globalTarget : globalTargets) {
        targets.emplace(globalTarget.Name,
                        this->CreateGlobalTarget(globalTarget, mf));
      }
    }
  }

  // update the cache entry for the number of local generators, this is used
  // for progress
  char num[100];
  sprintf(num, "%d", static_cast<int>(this->Makefiles.size()));
  this->GetCMakeInstance()->AddCacheEntry("CMAKE_NUMBER_OF_MAKEFILES", num,
                                          "number of local generators",
                                          cmStateEnums::INTERNAL);

  // check for link libraries and include directories containing "NOTFOUND"
  // and for infinite loops
  this->CheckTargetProperties();

  if (this->CMakeInstance->GetWorkingMode() == cmake::NORMAL_MODE) {
    std::ostringstream msg;
    if (cmSystemTools::GetErrorOccuredFlag()) {
      msg << "Configuring incomplete, errors occurred!";
      const char* logs[] = { "CMakeOutput.log", "CMakeError.log", nullptr };
      for (const char** log = logs; *log; ++log) {
        std::string f = this->CMakeInstance->GetHomeOutputDirectory();
        f += "/CMakeFiles";
        f += "/";
        f += *log;
        if (cmSystemTools::FileExists(f)) {
          msg << "\nSee also \"" << f << "\".";
        }
      }
    } else {
      msg << "Configuring done";
    }
    this->CMakeInstance->UpdateProgress(msg.str(), -1);
  }
}